

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmlookup.cpp
# Opt level: O0

void __thiscall CVmObjLookupTable::discard_undo(CVmObjLookupTable *this,CVmUndoRecord *rec)

{
  long in_RSI;
  
  if (*(long *)(in_RSI + 8) != 0) {
    free(*(void **)(in_RSI + 8));
    *(undefined8 *)(in_RSI + 8) = 0;
  }
  return;
}

Assistant:

void CVmObjLookupTable::discard_undo(VMG_ CVmUndoRecord *rec)
{
    /* delete our extra information record */
    if (rec->id.ptrval != 0)
    {
        /* free the record */
        t3free((lookuptab_undo_rec *)rec->id.ptrval);

        /* clear the pointer so we know it's gone */
        rec->id.ptrval = 0;
    }
}